

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  Enum EVar5;
  ulong uVar6;
  pointer pLVar7;
  pointer pLVar8;
  ulong uVar9;
  long lVar10;
  pointer pLVar11;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pLVar2 - (long)pLVar1;
  uVar6 = (lVar10 >> 3) * -0x5555555555555555;
  if (uVar6 < 0x4000) {
    if (pLVar2 == (this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (lVar10 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = 1;
      if (pLVar2 != pLVar1) {
        uVar9 = uVar6;
      }
      pLVar7 = (pointer)operator_new((uVar9 + uVar6) * 0x18);
      *(LabelType *)((long)pLVar7 + lVar10) = label_type;
      *(ExprList **)((long)pLVar7 + lVar10 + 8) = first;
      *(Expr **)((long)pLVar7 + lVar10 + 0x10) = context;
      pLVar11 = pLVar7;
      for (pLVar8 = pLVar1; pLVar2 != pLVar8; pLVar8 = pLVar8 + 1) {
        pLVar11->context = pLVar8->context;
        uVar4 = *(undefined4 *)&pLVar8->field_0x4;
        pEVar3 = pLVar8->exprs;
        pLVar11->label_type = pLVar8->label_type;
        *(undefined4 *)&pLVar11->field_0x4 = uVar4;
        pLVar11->exprs = pEVar3;
        pLVar11 = pLVar11 + 1;
      }
      if (pLVar1 != (pointer)0x0) {
        operator_delete(pLVar1,(long)(this->label_stack_).
                                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pLVar1);
      }
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_start = pLVar7;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar11 + 1;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar7 + uVar9 + uVar6;
    }
    else {
      pLVar2->label_type = label_type;
      pLVar2->exprs = first;
      pLVar2->context = context;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + 1;
    }
    EVar5 = Ok;
  }
  else {
    PrintError(this,"label stack exceeds max nesting depth");
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderIR::PushLabel(LabelType label_type,
                                 ExprList* first,
                                 Expr* context) {
  if (label_stack_.size() >= kMaxNestingDepth) {
    PrintError("label stack exceeds max nesting depth");
    return Result::Error;
  }
  label_stack_.emplace_back(label_type, first, context);
  return Result::Ok;
}